

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::EventLoop::~EventLoop(EventLoop *this)

{
  Own<kj::TaskSet,_std::nullptr_t> *this_00;
  TaskSet *pTVar1;
  Disposer *pDVar2;
  Executor *pEVar3;
  Event *pEVar4;
  Event *pEVar5;
  TaskSet *ptrCopy;
  long *in_FS_OFFSET;
  DebugComparison<kj::_::Event_*&,_std::nullptr_t> _kjCondition;
  Fault f;
  Fault f_1;
  
  this_00 = &this->daemons;
  while (pTVar1 = (this->daemons).ptr, (pTVar1->tasks).ptr.ptr != (Task *)0x0) {
    pDVar2 = (this->daemons).disposer;
    (this->daemons).ptr = (TaskSet *)0x0;
    heap<kj::TaskSet,kj::_::LoggingErrorHandler&>
              ((kj *)&_kjCondition,(LoggingErrorHandler *)&kj::_::LoggingErrorHandler::instance);
    Own<kj::TaskSet,_std::nullptr_t>::operator=
              (this_00,(Own<kj::TaskSet,_std::nullptr_t> *)&_kjCondition);
    if (_kjCondition.right != (void *)0x0) {
      _kjCondition.right = (void *)0x0;
      (*(code *)(*_kjCondition.left)->_vptr_Event)();
    }
    (**pDVar2->_vptr_Disposer)(pDVar2,pTVar1);
  }
  Own<kj::TaskSet,_std::nullptr_t>::dispose(this_00);
  pEVar3 = (this->executor).ptr.ptr;
  if (pEVar3 != (Executor *)0x0) {
    Executor::Impl::disconnect((pEVar3->impl).ptr);
  }
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = this->head == (Event *)0x0;
  if (!_kjCondition.result) {
    _kjCondition.left = &this->head;
    kj::_::Event::traceEvent((String *)&f_1,this->head);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::Event*&,decltype(nullptr)>&,char_const(&)[66],kj::String>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x6f0,FAILED,"head == nullptr",
               "_kjCondition,\"EventLoop destroyed with events still in the queue.  Memory leak?\", head->traceEvent()"
               ,&_kjCondition,
               (char (*) [66])"EventLoop destroyed with events still in the queue.  Memory leak?",
               (String *)&f_1);
    Array<char>::~Array((Array<char> *)&f_1);
    pEVar5 = this->head;
    while (pEVar5 != (Event *)0x0) {
      pEVar4 = pEVar5->next;
      pEVar5->next = (Event *)0x0;
      pEVar5->prev = (Event **)0x0;
      pEVar5 = pEVar4;
    }
    kj::_::Debug::Fault::~Fault(&f);
  }
  _kjCondition.left = (Event **)(*in_FS_OFFSET + -0x28);
  _kjCondition.op.content.ptr = anon_var_dwarf_43885;
  _kjCondition.result = (EventLoop *)in_FS_OFFSET[-5] != this;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.right = this;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*&,kj::EventLoop*>&,char_const(&)[56]>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x6fd,FAILED,"threadLocalEventLoop != this",
               "_kjCondition,\"EventLoop destroyed while still current for the thread.\"",
               (DebugComparison<kj::EventLoop_*&,_kj::EventLoop_*> *)&_kjCondition,
               (char (*) [56])"EventLoop destroyed while still current for the thread.");
    in_FS_OFFSET[-5] = 0;
    kj::_::Debug::Fault::~Fault(&f_1);
  }
  Own<kj::TaskSet,_std::nullptr_t>::dispose(this_00);
  Own<kj::EventLoop::LocalMap,_std::nullptr_t>::dispose(&(this->localMap).ptr);
  Own<kj::Executor,_std::nullptr_t>::dispose(&(this->executor).ptr);
  return;
}

Assistant:

EventLoop::~EventLoop() noexcept(false) {
  // Destroy all "daemon" tasks, noting that their destructors might register more daemon tasks.
  while (!daemons->isEmpty()) {
    auto oldDaemons = kj::mv(daemons);
    daemons = kj::heap<TaskSet>(_::LoggingErrorHandler::instance);
  }
  daemons = nullptr;

  KJ_IF_SOME(e, executor) {
    // Cancel all outstanding cross-thread events.
    e->impl->disconnect();
  }

  // The application _should_ destroy everything using the EventLoop before destroying the
  // EventLoop itself, so if there are events on the loop, this indicates a memory leak.
  KJ_REQUIRE(head == nullptr, "EventLoop destroyed with events still in the queue.  Memory leak?",
             head->traceEvent()) {
    // Unlink all the events and hope that no one ever fires them...
    _::Event* event = head;
    while (event != nullptr) {
      _::Event* next = event->next;
      event->next = nullptr;
      event->prev = nullptr;
      event = next;
    }
    break;
  }

  KJ_REQUIRE(threadLocalEventLoop != this,
             "EventLoop destroyed while still current for the thread.") {
    threadLocalEventLoop = nullptr;
    break;
  }
}